

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O1

void __thiscall xray_re::xr_glow_object::xr_glow_object(xr_glow_object *this,xr_scene *scene)

{
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_GLOW);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_glow_object_002499b0;
  (this->m_shader)._M_dataplus._M_p = (pointer)&(this->m_shader).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_shader,"effects\\glow","");
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  this->m_radius = 0.5;
  this->m_flags = 0;
  return;
}

Assistant:

xr_glow_object::xr_glow_object(xr_scene& scene):
	xr_custom_object(scene, TOOLS_CLASS_GLOW),
	m_shader("effects\\glow"), m_radius(0.5f), m_flags(0) {}